

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O2

int mmk_strneq(char *src,char *ref,size_t n)

{
  size_t sVar1;
  
  sVar1 = 0;
  while( true ) {
    if (((src[sVar1] == '\0') || (ref[sVar1] == '\0')) || (n == sVar1)) break;
    if (src[sVar1] != ref[sVar1]) {
      return 0;
    }
    sVar1 = sVar1 + 1;
  }
  if (n == sVar1) {
    return 1;
  }
  return (int)(ref[sVar1] == '\0');
}

Assistant:

int mmk_strneq(const char *src, const char *ref, size_t n)
{
    for (; *src && *ref && n; ++src, ++ref, --n) {
        if (*src != *ref)
            return 0;
    }
    return n == 0 || !*ref;
}